

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_info.hpp
# Opt level: O0

Type_Info *
chaiscript::detail::
Get_Type_Info<const_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
::get(void)

{
  Type_Info *in_RDI;
  
  Type_Info::Type_Info
            (in_RDI,true,false,false,false,false,
             (type_info *)
             &std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::typeinfo
             ,(type_info *)
              &std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
               typeinfo);
  return in_RDI;
}

Assistant:

static Type_Info get()
        {
          return Type_Info(std::is_const<typename std::remove_pointer<typename std::remove_reference<T>::type>::type>::value, 
              std::is_reference<T>::value, std::is_pointer<T>::value, 
              std::is_void<T>::value,
              (std::is_arithmetic<T>::value || std::is_arithmetic<typename std::remove_reference<T>::type>::value)
                && !std::is_same<typename std::remove_const<typename std::remove_reference<T>::type>::type, bool>::value,
              &typeid(T),
              &typeid(typename Bare_Type<T>::type));
        }